

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hh
# Opt level: O2

int anon_unknown.dwarf_acf92::digittoint(int c)

{
  int iVar1;
  
  switch(c) {
  case 0x31:
    iVar1 = 1;
    break;
  case 0x32:
    iVar1 = 2;
    break;
  case 0x33:
    iVar1 = 3;
    break;
  case 0x34:
    iVar1 = 4;
    break;
  case 0x35:
    iVar1 = 5;
    break;
  case 0x36:
    iVar1 = 6;
    break;
  case 0x37:
    iVar1 = 7;
    break;
  case 0x38:
    iVar1 = 8;
    break;
  case 0x39:
    iVar1 = 9;
    break;
  default:
    switch(c) {
    case 0x61:
      iVar1 = 10;
      break;
    case 0x62:
      iVar1 = 0xb;
      break;
    case 99:
      iVar1 = 0xc;
      break;
    case 100:
      iVar1 = 0xd;
      break;
    case 0x65:
      iVar1 = 0xe;
      break;
    case 0x66:
      iVar1 = 0xf;
      break;
    default:
      return 0;
    }
  }
  return iVar1;
}

Assistant:

inline int digittoint(int c)
	{
		switch (c)
		{
			default:
			case '0': return 0;
			case '1': return 1;
			case '2': return 2;
			case '3': return 3;
			case '4': return 4;
			case '5': return 5;
			case '6': return 6;
			case '7': return 7;
			case '8': return 8;
			case '9': return 9;
			case 'a': return 10;
			case 'b': return 11;
			case 'c': return 12;
			case 'd': return 13;
			case 'e': return 14;
			case 'f': return 15;
		}
	}